

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.c
# Opt level: O0

void prf_messages_add_handler
               (int type,int level,_func_void_int_int_char_ptr_void_ptr *func,void *data)

{
  int iVar1;
  prf_msg_handler_t *ppVar2;
  prf_msg_handler_t **pppVar3;
  void *in_RCX;
  _func_void_int_int_char_ptr_void_ptr *in_RDX;
  int in_ESI;
  int in_EDI;
  int count;
  int i;
  prf_msg_handler_t *handler;
  int local_24;
  
  ppVar2 = (prf_msg_handler_t *)malloc(0x18);
  ppVar2->level = in_ESI;
  ppVar2->func = in_RDX;
  ppVar2->userdata = in_RCX;
  iVar1 = prf_array_count((void *)0x116999);
  local_24 = 0;
  while( true ) {
    if (iVar1 <= local_24) {
      pppVar3 = (prf_msg_handler_t **)prf_array_append_ptr(in_RDX,in_RCX);
      prf_handlers[in_EDI] = pppVar3;
      return;
    }
    if (prf_handlers[in_EDI][local_24] == (prf_msg_handler_t *)0x0) break;
    local_24 = local_24 + 1;
  }
  prf_handlers[in_EDI][local_24] = ppVar2;
  return;
}

Assistant:

void
prf_messages_add_handler(
    int type,
    int level,
    void (*func)( int, int, const char *, void * ),
    void * data )
{
    prf_msg_handler_t * handler;
    int i = 0, count;
    assert( type > 0 && type < 6 );
    handler = (prf_msg_handler_t *)malloc( sizeof( prf_msg_handler_t ) );
    assert( handler != NULL );
    handler->level = level;
    handler->func = func;
    handler->userdata = data;
    count = prf_array_count( prf_handlers[type] );
    for ( i = 0; i < count; i++ ) {
        if ( prf_handlers[type][i] == NULL ) {
            prf_handlers[type][i] = handler;
            return;
        }
    }
    prf_handlers[type] = 
      (prf_msg_handler_t **)prf_array_append_ptr( prf_handlers[type], handler);
}